

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

int __thiscall PGSStreamReader::readPacket(PGSStreamReader *this,AVPacket *avPacket)

{
  uint8_t **ppuVar1;
  pointer *ppPVar2;
  double dVar3;
  uint8_t uVar4;
  ushort uVar5;
  pointer pPVar6;
  pointer __dest;
  pointer pPVar7;
  uint16_t uVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  long lVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  ostream *poVar15;
  long *plVar16;
  int64_t iVar17;
  long lVar18;
  size_t sVar19;
  PESPacket *this_00;
  ulong uVar20;
  long lVar21;
  pointer __dest_00;
  uint uVar22;
  bool bVar23;
  ulong uVar24;
  uint16_t tmpHeight;
  BitStreamReader bitReader;
  char local_5f;
  uint16_t local_5e;
  uint local_5c;
  BitStreamReader local_58;
  ulong local_38;
  
  avPacket->size = 0;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->codecID = 0xc;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = 0;
  avPacket->duration = 0;
  pPVar6 = (this->m_renderedBlocks).
           super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar6 != (this->m_renderedBlocks).
                super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->m_firstRenderedPacket == true) {
      avPacket->flags = 4;
    }
    this->m_firstRenderedPacket = false;
    puVar13 = pPVar6->data;
    avPacket->data = puVar13;
    uVar22 = pPVar6->len;
    uVar20 = 0x8000;
    if (uVar22 < 0x8000) {
      uVar20 = (ulong)uVar22;
    }
    avPacket->size = (int)uVar20;
    avPacket->pts = pPVar6->pts * 0xe5b0;
    avPacket->dts = pPVar6->dts * 0xe5b0;
    pPVar6->data = puVar13 + uVar20;
    pPVar6->len = uVar22 - (int)uVar20;
    if (0x8000 < uVar22) {
      return 0;
    }
    __dest = (this->m_renderedBlocks).
             super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar7 = (this->m_renderedBlocks).
             super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pPVar6 = __dest + 1;
    if (pPVar6 != pPVar7) {
      memmove(__dest,pPVar6,(long)pPVar7 - (long)pPVar6);
    }
    ppPVar2 = &(this->m_renderedBlocks).
               super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar2 = *ppPVar2 + -1;
    this->m_firstRenderedPacket = true;
    return 0;
  }
  puVar13 = (this->super_AbstractStreamReader).m_curPos;
  if (puVar13 == (uint8_t *)0x0) {
    return 1;
  }
  if (this->m_video_height == 0) {
    intDecodeStream(this,puVar13,(long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar13);
    if (this->m_video_height == 0) {
      return 1;
    }
    text_subtitles::TextToPGSConverter::enlargeCrop
              (this->m_render,this->m_video_width,this->m_video_height,(uint16_t *)&local_58,
               &local_5e);
    uVar5 = this->m_scaled_width;
    if (((ulong)uVar5 == 0) ||
       (bVar23 = true, uVar5 == (ushort)local_58.super_BitStream.m_totalBits)) {
      if (this->m_scaled_height == 0) {
        bVar23 = false;
      }
      else {
        bVar23 = this->m_scaled_height != local_5e;
      }
    }
    this->m_needRescale = bVar23;
    if (bVar23 != false) {
      uVar22 = (uint)this->m_video_height * (uint)this->m_video_width;
      local_5c = (uint)this->m_scaled_height;
      uVar20 = -(ulong)(uVar22 == 0) | (ulong)uVar22;
      local_38 = (ulong)uVar5;
      puVar13 = (uint8_t *)operator_new__(uVar20);
      *puVar13 = 0xff;
      memset(puVar13 + 1,0,uVar20 - 1);
      this->m_imgBuffer = puVar13;
      puVar13 = (uint8_t *)operator_new__((ulong)(uVar22 * 4));
      memset(puVar13,0,(ulong)(uVar22 * 4));
      uVar22 = local_5c;
      this->m_rgbBuffer = puVar13;
      uVar20 = (ulong)((int)local_38 * local_5c * 4);
      puVar13 = (uint8_t *)operator_new__(uVar20);
      memset(puVar13,0,uVar20);
      this->m_scaledRgbBuffer = puVar13;
      puVar14 = (uint8_t *)operator_new__((ulong)(((int)local_38 + 0x10) * uVar22 + 0x4000));
      this->m_renderedData = puVar14;
      this->m_render->m_imageBuffer = puVar13;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Decoding PGS stream (track ",0x1b);
    poVar15 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,(this->super_AbstractStreamReader).m_streamIndex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"): ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," Resolution: ",0xd);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    local_5f = ':';
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_5f,1);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"  Frame rate: ",0xe);
    poVar15 = std::ostream::_M_insert<double>(this->m_frame_rate);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    sLastMsg = true;
    dVar3 = this->m_newFps;
    if (((dVar3 != 0.0) || (NAN(dVar3))) &&
       (dVar3 = dVar3 - this->m_frame_rate, uVar20 = -(ulong)(dVar3 < -dVar3),
       0.0001 < (double)(~uVar20 & (ulong)dVar3 | (ulong)-dVar3 & uVar20))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Change FPS from ",0x10);
      poVar15 = std::ostream::_M_insert<double>(this->m_frame_rate);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," to ",4);
      poVar15 = std::ostream::_M_insert<double>(this->m_newFps);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," for PGS stream #",0x11);
      plVar16 = (long *)std::ostream::operator<<
                                  (poVar15,(this->super_AbstractStreamReader).m_streamIndex);
      std::ios::widen((char)*(undefined8 *)(*plVar16 + -0x18) + (char)plVar16);
      std::ostream::put((char)plVar16);
      std::ostream::flush();
      sLastMsg = true;
      this->m_scale = this->m_frame_rate / this->m_newFps;
    }
    if (this->m_needRescale == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Change PGS resolution from ",0x1b);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_5f = ':';
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_5f,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," to ",4);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      local_5f = ':';
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_5f,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,". Scaling method: Bilinear interpolation",0x28);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      sLastMsg = true;
    }
  }
  this_00 = (PESPacket *)(this->super_AbstractStreamReader).m_curPos;
  if (this->m_state == stAVPacketFragmented) {
    iVar9 = *(int *)&this->m_avFragmentEnd - (int)this_00;
    iVar11 = 0x8000;
    if (iVar9 < 0x8001) {
      this->m_state = stParsePES;
      iVar11 = iVar9;
    }
    lVar12 = this->m_lastPTS;
    avPacket->pts = lVar12;
    lVar18 = this->m_lastDTS;
    avPacket->dts = lVar18;
    avPacket->data = (uint8_t *)this_00;
    bVar23 = this->m_needRescale;
    lVar21 = (long)iVar11;
    if (bVar23 != false) {
      iVar11 = 0;
    }
    avPacket->size = iVar11;
    (this->super_AbstractStreamReader).m_curPos = &this_00->startCode0 + lVar21;
    this->m_processedSize = this->m_processedSize + lVar21;
    if (bVar23 != true) {
      return 0;
    }
    goto LAB_001ca935;
  }
  sVar19 = (long)(this->super_AbstractStreamReader).m_bufEnd - (long)this_00;
  if (2 < (long)sVar19) {
    if (this_00->startCode0 == '\0') {
      if ((this_00->startCode1 != '\0') || (this_00->startCode2 != '\x01')) goto LAB_001cafcb;
      if ((7 < (long)sVar19) &&
         (uVar20 = (ulong)(byte)(this_00->m_pesHeaderLen + 9), (long)uVar20 <= (long)sVar19)) {
        if ((char)this_00->flagsLo < '\0') {
          iVar17 = PESPacket::getPts(this_00);
          lVar12 = iVar17 * 0xe5b0 + -0x1cb6000000000;
          if (iVar17 < 0x1ff000001) {
            lVar12 = iVar17 * 0xe5b0;
          }
          this->m_lastPTS = lVar12;
          this->m_lastDTS = lVar12;
          if (lVar12 <= this->m_maxPTS) {
            lVar12 = this->m_maxPTS;
          }
          this->m_maxPTS = lVar12;
        }
        if (0xbf < this_00->flagsLo) {
          iVar17 = PESPacket::getDts(this_00);
          lVar12 = iVar17 * 0xe5b0 + -0x1cb6000000000;
          if (iVar17 < 0x1ff000001) {
            lVar12 = iVar17 * 0xe5b0;
          }
          this->m_lastDTS = lVar12;
        }
        ppuVar1 = &(this->super_AbstractStreamReader).m_curPos;
        *ppuVar1 = *ppuVar1 + uVar20;
        this->m_processedSize = this->m_processedSize + uVar20;
        goto LAB_001caad4;
      }
    }
    else {
      if ((this_00->startCode0 != 'P') || (this_00->startCode1 != 'G')) {
LAB_001cafcb:
        avPacket->data = (uint8_t *)this_00;
        uVar4 = this_00->startCode0;
        uVar8 = AV_RB16(&this_00->startCode1);
        this_00 = (PESPacket *)(this->super_AbstractStreamReader).m_curPos;
        puVar13 = (this->super_AbstractStreamReader).m_bufEnd;
        sVar19 = (long)puVar13 - (long)this_00;
        uVar20 = (ulong)uVar8;
        if ((long)(uVar20 + 3) <= (long)sVar19) {
          puVar14 = &this_00->m_streamID;
          (this->super_AbstractStreamReader).m_curPos = puVar14;
          local_58.super_BitStream.m_totalBits = 0;
          local_58.super_BitStream.m_buffer = (uint *)0x0;
          local_58.super_BitStream.m_initBuffer = (uint *)0x0;
          local_58.m_curVal = 0;
          local_58.m_bitLeft = 0;
          switch(uVar4) {
          case '\x14':
            if (this->m_needRescale == true) {
              readPalette(this,puVar14,puVar14 + uVar20);
            }
            break;
          case '\x15':
            if (this->m_needRescale == true) {
              memset(this->m_imgBuffer,0xff,(ulong)this->m_video_height * (ulong)this->m_video_width
                    );
              memset(this->m_rgbBuffer,0,
                     (ulong)this->m_video_height * (ulong)this->m_video_width * 4);
              memset(this->m_scaledRgbBuffer,0,
                     (ulong)this->m_scaled_height * (ulong)this->m_scaled_width * 4);
              puVar13 = (this->super_AbstractStreamReader).m_curPos;
              iVar11 = readObjectDef(this,puVar13,puVar13 + uVar20);
              if (iVar11 != 0) {
                puVar13 = (this->super_AbstractStreamReader).m_curPos;
                sVar19 = (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar13;
                (this->super_AbstractStreamReader).m_tmpBufferLen = sVar19;
                memmove((this->m_tmpBuffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,puVar13,sVar19);
                return 1;
              }
              renderTextShow(this,this->m_maxPTS);
            }
            break;
          case '\x16':
            dVar3 = this->m_scale + -1.0;
            uVar24 = -(ulong)(dVar3 < -dVar3);
            if (0.0001 < (double)(~uVar24 & (ulong)dVar3 | (ulong)-dVar3 & uVar24)) {
              iVar11 = calcFpsIndex(this->m_newFps);
              (this->super_AbstractStreamReader).m_curPos[4] = (char)iVar11 << 4;
            }
            BitStreamReader::setBuffer
                      (&local_58,(this->super_AbstractStreamReader).m_curPos,
                       (this->super_AbstractStreamReader).m_bufEnd);
            video_descriptor(this,&local_58);
            composition_descriptor(this,&local_58);
            BitStreamReader::skipBits(&local_58,0x10);
            uVar22 = BitStreamReader::getBits(&local_58,8);
            uVar22 = uVar22 & 0xff;
            if (uVar22 != 0) {
              do {
                composition_object(this,&local_58);
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            if ((this->composition_state != csEpochStart) && (this->m_needRescale == true)) {
              renderTextHide(this,this->m_maxPTS);
            }
            break;
          case '\x17':
            BitStreamReader::setBuffer(&local_58,puVar14,puVar13);
            uVar22 = BitStreamReader::getBits(&local_58,8);
            uVar22 = uVar22 & 0xff;
            if (uVar22 != 0) {
              do {
                pgs_window(&local_58);
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
          }
          lVar12 = this->m_lastPTS;
          avPacket->pts = lVar12;
          lVar18 = this->m_lastDTS;
          avPacket->dts = lVar18;
          if (this->m_isNewFrame == true) {
            if (this->m_needRescale == false) {
              avPacket->flags = avPacket->flags + 4;
            }
            this->m_isNewFrame = false;
          }
          if (0x7ffd < uVar8) {
            this->m_state = stAVPacketFragmented;
            this->m_avFragmentEnd = (this->super_AbstractStreamReader).m_curPos + uVar20;
            uVar20 = 0x7ffd;
          }
          ppuVar1 = &(this->super_AbstractStreamReader).m_curPos;
          *ppuVar1 = *ppuVar1 + uVar20;
          this->m_processedSize = uVar20 + this->m_processedSize + 3;
          avPacket->size = (int)uVar20 + 3;
          if (this->m_needRescale != true) {
            return 0;
          }
          pPVar6 = (this->m_renderedBlocks).
                   super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pPVar6 == (this->m_renderedBlocks).
                        super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            if (lVar18 < 1) {
              lVar18 = 0;
            }
            avPacket->dts = lVar18;
            lVar18 = 0;
            if (0 < lVar12) {
              lVar18 = lVar12;
            }
            avPacket->pts = lVar18;
          }
          else {
            avPacket->pts = pPVar6->pts * 0xe5b0;
            avPacket->dts = pPVar6->dts * 0xe5b0;
          }
          avPacket->size = 0;
          return 0;
        }
        (this->super_AbstractStreamReader).m_tmpBufferLen = sVar19;
        __dest_00 = (this->m_tmpBuffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        goto LAB_001cb006;
      }
      if (9 < (long)sVar19) {
        uVar10 = AV_RB32(&this_00->startCode2);
        lVar12 = (ulong)uVar10 * 0xe5b0 + -0xe5b000000000;
        if (uVar10 < 0xff000001) {
          lVar12 = (ulong)uVar10 * 0xe5b0;
        }
        lVar12 = (long)((double)lVar12 * this->m_scale);
        this->m_lastPTS = lVar12;
        puVar13 = (this->super_AbstractStreamReader).m_curPos;
        if (lVar12 < this->m_maxPTS) {
          lVar12 = this->m_maxPTS;
        }
        this->m_maxPTS = lVar12;
        uVar10 = AV_RB32(puVar13 + 6);
        lVar12 = (ulong)uVar10 * 0xe5b0 + -0xe5b000000000;
        if (uVar10 < 0xff000001) {
          lVar12 = (ulong)uVar10 * 0xe5b0;
        }
        lVar12 = (long)((double)lVar12 * this->m_scale);
        this->m_lastDTS = lVar12;
        if (lVar12 == 0) {
          this->m_lastDTS = this->m_lastPTS;
        }
        ppuVar1 = &(this->super_AbstractStreamReader).m_curPos;
        *ppuVar1 = *ppuVar1 + 10;
        this->m_processedSize = this->m_processedSize + 10;
LAB_001caad4:
        this->m_state = stParsePGS;
        lVar12 = this->m_lastPTS;
        avPacket->pts = lVar12;
        lVar18 = this->m_lastDTS;
        avPacket->dts = lVar18;
        this->m_isNewFrame = true;
        if (this->m_needRescale != true) {
          return 0;
        }
LAB_001ca935:
        if (lVar18 < 1) {
          lVar18 = 0;
        }
        avPacket->dts = lVar18;
        if (lVar12 < 1) {
          lVar12 = 0;
        }
        avPacket->pts = lVar12;
        return 0;
      }
    }
  }
  (this->super_AbstractStreamReader).m_tmpBufferLen = sVar19;
  __dest_00 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_001cb006:
  memmove(__dest_00,this_00,sVar19);
  return 1;
}

Assistant:

int PGSStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.size = 0;
    avPacket.codec = this;
    avPacket.codecID = CODEC_S_PGS;
    avPacket.stream_index = m_streamIndex;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = 0;
    avPacket.duration = 0;

    if (!m_renderedBlocks.empty())
    {  // rendered data block (rescaled PGS). send it.
        if (m_firstRenderedPacket)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_firstRenderedPacket = false;
        PGSRenderedBlock& block = m_renderedBlocks[0];
        avPacket.data = block.data;
        avPacket.size = FFMIN(MAX_AV_PACKET_SIZE, block.len);
        avPacket.pts = block.pts * INT_FREQ_TO_TS_FREQ;
        avPacket.dts = block.dts * INT_FREQ_TO_TS_FREQ;
        block.data += avPacket.size;
        block.len -= avPacket.size;
        if (block.len == 0)
        {
            m_renderedBlocks.erase(m_renderedBlocks.begin());
            m_firstRenderedPacket = true;
        }
        return 0;
    }

    if (m_curPos == nullptr)
        return NEED_MORE_DATA;

    if (m_video_height == 0)
    {
        intDecodeStream(m_curPos, m_bufEnd - m_curPos);
        if (m_video_height == 0)
            return NEED_MORE_DATA;

        uint16_t tmpWidth;
        uint16_t tmpHeight;
        m_render->enlargeCrop(m_video_width, m_video_height, &tmpWidth, &tmpHeight);
        m_needRescale =
            (m_scaled_width && m_scaled_width != tmpWidth) || (m_scaled_height && m_scaled_height != tmpHeight);
        if (m_needRescale)
        {
            const unsigned size = m_video_width * m_video_height;
            const unsigned scaled_size = m_scaled_width * m_scaled_height;
            m_imgBuffer = new uint8_t[size]{0xff};
            m_rgbBuffer = new uint8_t[size << 2]{};
            m_scaledRgbBuffer = new uint8_t[scaled_size << 2]{};
            m_renderedData = new uint8_t[(m_scaled_width + 16) * m_scaled_height + 16384];
            m_render->setImageBuffer(m_scaledRgbBuffer);
        }
        LTRACE(LT_INFO, 2,
               "Decoding PGS stream (track " << m_streamIndex << "): "
                                             << " Resolution: " << m_video_width << ':' << m_video_height
                                             << "  Frame rate: " << m_frame_rate);
        if (m_newFps != 0.0 && fabs(m_newFps - m_frame_rate) > 1e-4)
        {
            LTRACE(LT_INFO, 2,
                   "Change FPS from " << m_frame_rate << " to " << m_newFps << " for PGS stream #" << m_streamIndex);
            m_scale = m_frame_rate / m_newFps;
        }
        if (m_needRescale)
            LTRACE(LT_INFO, 2,
                   "Change PGS resolution from " << m_video_width << ':' << m_video_height << " to " << m_scaled_width
                                                 << ':' << m_scaled_height
                                                 << ". Scaling method: Bilinear interpolation");
    }

    if (m_state == State::stAVPacketFragmented)
    {
        int avLen = static_cast<int>(m_avFragmentEnd - m_curPos);
        if (avLen > MAX_AV_PACKET_SIZE)
        {
            avLen = MAX_AV_PACKET_SIZE;
        }
        else
            m_state = State::stParsePES;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        avPacket.data = m_curPos;
        avPacket.size = m_needRescale ? 0 : avLen;
        m_curPos += avLen;
        m_processedSize += avLen;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const bool pgStartCode = m_curPos[0] == 'P' && m_curPos[1] == 'G';
    if (pgStartCode)
    {
        if (m_bufEnd - m_curPos < 10)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        m_lastPTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 2)) * m_scale);
        m_maxPTS = FFMAX(m_maxPTS, m_lastPTS);
        m_lastDTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 6)) * m_scale);
        if (m_lastDTS == 0)
            m_lastDTS = m_lastPTS;
        m_curPos += 10;
        m_processedSize += 10;
        m_state = State::stParsePGS;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;

        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    const bool pesStartCode = m_curPos[0] == 0 && m_curPos[1] == 0 && m_curPos[2] == 01;

    if (pesStartCode)
    {
        if (m_bufEnd - m_curPos < 8)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        const auto pesPacket = reinterpret_cast<PESPacket*>(m_curPos);
        const int pesHeaderLen = pesPacket->getHeaderLength();
        // if (m_bufEnd - m_curPos < pesHeaderLen+1) {
        if (m_bufEnd - m_curPos < pesHeaderLen)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        if (pesPacket->flagsLo & 0x80)
        {  // pts exists
            m_lastDTS = m_lastPTS = getTimeValueNano(pesPacket->getPts());
            m_maxPTS = FFMAX(m_lastPTS, m_maxPTS);
        }
        if ((pesPacket->flagsLo & 0xc0) == 0xc0)  // dts exists
            m_lastDTS = getTimeValueNano(pesPacket->getDts());
        m_curPos += pesHeaderLen;
        m_processedSize += pesHeaderLen;
        m_state = State::stParsePGS;

        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;
        // m_afterPesByte = *m_curPos;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    avPacket.data = m_curPos;
    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const uint8_t segment_type = *m_curPos;
    const auto segment_len = AV_RB16(m_curPos + 1);
    if (m_bufEnd - m_curPos < 3ll + segment_len)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    m_curPos += 3;
    BitStreamReader bitReader{};
    try
    {
        uint8_t number_of_composition_objects, number_of_windows;
        switch (segment_type)
        {
        case PALETTE_DEF_SEGMENT:
            // pallete definition
            // m_palleteID = m_curPos[0];
            // m_paletteVersion = m_curPos[1];
            if (m_needRescale)
                readPalette(m_curPos, m_curPos + segment_len);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " palette definition");
            break;
        case OBJECT_DEF_SEGMENT:
            // object definition
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " object definition size " << segment_len
            //	  << " objectID=" << (int)m_curPos[0] << " version=" << (int) m_curPos[2]);
            if (m_needRescale)
            {
                memset(m_imgBuffer, 0xff, static_cast<size_t>(m_video_width) * m_video_height);
                memset(m_rgbBuffer, 0x00, static_cast<size_t>(m_video_width) * m_video_height * 4);
                memset(m_scaledRgbBuffer, 0x00, static_cast<size_t>(m_scaled_width) * m_scaled_height * 4);
                if (readObjectDef(m_curPos, m_curPos + segment_len) == NEED_MORE_DATA)
                {
                    m_tmpBufferLen = m_bufEnd - m_curPos;
                    memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
                    return NEED_MORE_DATA;
                }
                renderTextShow(m_maxPTS);
            }
            break;
        case PCS_DEF_SEGMENT:
            // Presentation Composition Segment
            if (fabs(m_scale - 1.0) > 1e-4)
                m_curPos[4] = static_cast<uint8_t>(calcFpsIndex(m_newFps) << 4);
            bitReader.setBuffer(m_curPos, m_bufEnd);
            video_descriptor(bitReader);
            composition_descriptor(bitReader);

            bitReader.skipBits(16);  // palette_update_flag, palette_id_ref
            number_of_composition_objects = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_composition_objects; i++)
            {
                composition_object(bitReader);
            }
            if (composition_state != CompositionState::csEpochStart && m_needRescale)
                renderTextHide(m_maxPTS);
            break;
        case WINDOWS_DEF_SEGMENT:
            // Window Definition Segment
            bitReader.setBuffer(m_curPos, m_bufEnd);
            number_of_windows = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_windows; i++) pgs_window(bitReader);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Window Definition Segment");
            break;
        case 0x18:
            // Interactive Composition Segment
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Interactive Composition Segment");
        case 0x80:
            // End of Display Set Segment
            // m_end_display_time = get_pts(curPos);
            // curPos += 5;
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " END");
        case 0x81:
        case 0x82:
            // Used by HDMV Text subtitle streams
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " TEXT DATA");
        default:
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " unknown type " << (int)segment_type);
            break;
        }
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NEED_MORE_DATA;
    }
    avPacket.pts = m_lastPTS;
    avPacket.dts = m_lastDTS;
    if (m_isNewFrame)
    {
        if (!m_needRescale)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_isNewFrame = false;
    }

    int avLen = segment_len;
    if (avLen > MAX_AV_PACKET_SIZE - 3)
    {
        avLen = MAX_AV_PACKET_SIZE - 3;
        m_state = State::stAVPacketFragmented;
        m_avFragmentEnd = m_curPos + segment_len;
    }
    m_curPos += avLen;
    m_processedSize += 3 + avLen;
    avPacket.size = 3 + avLen;
    if (m_needRescale)
    {
        if (!m_renderedBlocks.empty())
        {
            avPacket.pts = m_renderedBlocks.begin()->pts * INT_FREQ_TO_TS_FREQ;
            avPacket.dts = m_renderedBlocks.begin()->dts * INT_FREQ_TO_TS_FREQ;
        }
        else
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        avPacket.size = 0;  // skip source palette object
    }
    return 0;
}